

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avxvnniint8.cpp
# Opt level: O3

void ncnn::transpose_pack_B_tile_int8_avxvnniint8(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void *pvVar1;
  undefined1 (*pauVar2) [16];
  long lVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong *puVar16;
  undefined1 *puVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_ZMM2 [64];
  long local_58;
  long local_50;
  
  pauVar2 = (undefined1 (*) [16])BT->data;
  iVar19 = B->w;
  lVar10 = (long)iVar19;
  uVar14 = 0;
  lVar3 = (long)k;
  lVar22 = (long)j;
  if (7 < max_jj) {
    lVar13 = (long)(iVar19 * 4);
    lVar8 = iVar19 * 3 + lVar22;
    lVar7 = lVar22 + iVar19 * 2;
    lVar25 = lVar10 + lVar22;
    uVar5 = 0;
    lVar26 = lVar22;
    do {
      pvVar1 = B->data;
      lVar12 = B->w * lVar3 * B->elemsize;
      if (max_kk < 4) {
        lVar24 = (long)pvVar1 + lVar22 + uVar5;
        uVar20 = 0;
      }
      else {
        lVar24 = (long)pvVar1 + lVar26;
        lVar9 = lVar8 + (long)pvVar1;
        lVar21 = (long)pvVar1 + lVar7;
        lVar15 = (long)pvVar1 + lVar25;
        iVar4 = 3;
        do {
          auVar28._8_8_ = 0;
          auVar28._0_8_ = *(ulong *)(lVar24 + lVar12);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(lVar15 + lVar12);
          auVar28 = vpunpcklbw_avx(auVar28,auVar31);
          auVar32._8_8_ = 0;
          auVar32._0_8_ = *(ulong *)(lVar21 + lVar12);
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *(ulong *)(lVar9 + lVar12);
          auVar31 = vpunpcklbw_avx(auVar32,auVar34);
          auVar32 = vpunpcklwd_avx(auVar28,auVar31);
          in_ZMM2 = ZEXT1664(auVar32);
          auVar28 = vpunpckhwd_avx(auVar28,auVar31);
          pauVar2[1] = auVar28;
          *pauVar2 = auVar32;
          pauVar2 = pauVar2 + 2;
          lVar24 = lVar24 + lVar13;
          lVar9 = lVar9 + lVar13;
          lVar21 = lVar21 + lVar13;
          lVar15 = lVar15 + lVar13;
          iVar4 = iVar4 + 4;
          uVar20 = max_kk & 0xfffffffc;
        } while (iVar4 < max_kk);
      }
      puVar16 = (ulong *)(lVar24 + lVar12);
      uVar11 = uVar20 | 1;
      while ((int)uVar11 < max_kk) {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *puVar16;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = *(ulong *)((long)puVar16 + lVar10);
        auVar28 = vpunpcklbw_avx(auVar29,auVar33);
        *pauVar2 = auVar28;
        pauVar2 = pauVar2 + 1;
        puVar16 = (ulong *)((long)puVar16 + (long)(iVar19 * 2));
        uVar11 = uVar20 + 3;
        uVar20 = uVar20 + 2;
      }
      iVar4 = max_kk - uVar20;
      if (iVar4 != 0 && (int)uVar20 <= max_kk) {
        do {
          *(ulong *)*pauVar2 = *puVar16;
          pauVar2 = (undefined1 (*) [16])(*pauVar2 + 8);
          puVar16 = (ulong *)((long)puVar16 + lVar10);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      uVar14 = uVar5 + 8;
      uVar23 = uVar5 + 0xf;
      lVar26 = lVar26 + 8;
      lVar8 = lVar8 + 8;
      lVar7 = lVar7 + 8;
      lVar25 = lVar25 + 8;
      uVar5 = uVar14;
    } while (uVar23 < (uint)max_jj);
  }
  auVar28 = _DAT_005a5a10;
  lVar7 = (long)max_jj;
  if ((int)((uint)uVar14 | 3) < max_jj) {
    auVar30._4_4_ = iVar19;
    auVar30._0_4_ = iVar19;
    auVar30._8_4_ = iVar19;
    auVar30._12_4_ = iVar19;
    vpmulld_avx(auVar30,_DAT_005a5490);
    uVar5 = uVar14 & 0xffffffff;
    do {
      puVar17 = (undefined1 *)((long)B->data + lVar22 + uVar5 + B->w * lVar3 * B->elemsize);
      uVar20 = 0;
      if (3 < max_kk) {
        iVar4 = 3;
        do {
          auVar31 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
          auVar31 = vpgatherdd((undefined1  [16])0x0,auVar31);
          auVar31 = vpshufb_avx(auVar31,auVar28);
          in_ZMM2 = ZEXT1664(auVar31);
          *pauVar2 = auVar31;
          pauVar2 = pauVar2 + 1;
          puVar17 = puVar17 + lVar10 * 4;
          iVar4 = iVar4 + 4;
          uVar20 = max_kk & 0xfffffffc;
        } while (iVar4 < max_kk);
      }
      uVar11 = uVar20 | 1;
      while ((int)uVar11 < max_kk) {
        (*pauVar2)[0] = *puVar17;
        (*pauVar2)[1] = puVar17[lVar10];
        (*pauVar2)[2] = puVar17[1];
        (*pauVar2)[3] = puVar17[iVar19 + 1];
        (*pauVar2)[4] = puVar17[2];
        (*pauVar2)[5] = puVar17[iVar19 + 2];
        (*pauVar2)[6] = puVar17[3];
        (*pauVar2)[7] = puVar17[iVar19 + 3];
        pauVar2 = (undefined1 (*) [16])(*pauVar2 + 8);
        puVar17 = puVar17 + lVar10 * 2;
        uVar11 = uVar20 + 3;
        uVar20 = uVar20 + 2;
      }
      iVar4 = max_kk - uVar20;
      if (iVar4 != 0 && (int)uVar20 <= max_kk) {
        puVar17 = puVar17 + 3;
        do {
          (*pauVar2)[0] = puVar17[-3];
          (*pauVar2)[1] = puVar17[-2];
          (*pauVar2)[2] = puVar17[-1];
          (*pauVar2)[3] = *puVar17;
          pauVar2 = (undefined1 (*) [16])(*pauVar2 + 4);
          puVar17 = puVar17 + lVar10;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      uVar14 = uVar5 + 4;
      lVar25 = uVar5 + 7;
      uVar5 = uVar14;
    } while (lVar25 < lVar7);
  }
  if ((int)((uint)uVar14 | 1) < max_jj) {
    lVar13 = (long)(iVar19 * 4);
    lVar25 = lVar22 + (uVar14 & 0xffffffff);
    lVar12 = (iVar19 * 3 + 1) + lVar25;
    lVar26 = (iVar19 + 1) + lVar25;
    lVar8 = iVar19 * 3 + lVar25;
    local_50 = iVar19 * 2 + lVar25;
    local_58 = lVar10 + lVar25;
    uVar5 = uVar14 & 0xffffffff;
    do {
      pvVar1 = B->data;
      lVar24 = B->w * lVar3 * B->elemsize;
      if (max_kk < 4) {
        lVar21 = (long)pvVar1 + lVar22 + uVar5;
        uVar20 = 0;
      }
      else {
        lVar21 = (long)pvVar1 + lVar25;
        lVar27 = lVar12 + (long)pvVar1;
        lVar9 = (long)pvVar1 + lVar26;
        lVar15 = (long)pvVar1 + lVar8;
        lVar6 = (long)pvVar1 + local_50;
        lVar18 = (long)pvVar1 + local_58;
        iVar4 = 3;
        do {
          (*pauVar2)[0] = *(undefined1 *)(lVar21 + lVar24);
          (*pauVar2)[1] = *(undefined1 *)(lVar18 + lVar24);
          (*pauVar2)[2] = *(undefined1 *)(lVar6 + lVar24);
          (*pauVar2)[3] = *(undefined1 *)(lVar15 + lVar24);
          (*pauVar2)[4] = *(undefined1 *)(lVar21 + 1 + lVar24);
          (*pauVar2)[5] = *(undefined1 *)(lVar9 + lVar24);
          (*pauVar2)[6] = *(undefined1 *)(lVar6 + 1 + lVar24);
          (*pauVar2)[7] = *(undefined1 *)(lVar27 + lVar24);
          pauVar2 = (undefined1 (*) [16])(*pauVar2 + 8);
          iVar4 = iVar4 + 4;
          lVar21 = lVar21 + lVar13;
          lVar27 = lVar27 + lVar13;
          lVar9 = lVar9 + lVar13;
          lVar15 = lVar15 + lVar13;
          lVar6 = lVar6 + lVar13;
          lVar18 = lVar18 + lVar13;
          uVar20 = max_kk & 0xfffffffc;
        } while (iVar4 < max_kk);
      }
      puVar17 = (undefined1 *)(lVar21 + lVar24);
      uVar11 = uVar20 | 1;
      while ((int)uVar11 < max_kk) {
        (*pauVar2)[0] = *puVar17;
        (*pauVar2)[1] = puVar17[lVar10];
        (*pauVar2)[2] = puVar17[1];
        (*pauVar2)[3] = puVar17[iVar19 + 1];
        pauVar2 = (undefined1 (*) [16])(*pauVar2 + 4);
        puVar17 = puVar17 + iVar19 * 2;
        uVar11 = uVar20 + 3;
        uVar20 = uVar20 + 2;
      }
      iVar4 = max_kk - uVar20;
      if (iVar4 != 0 && (int)uVar20 <= max_kk) {
        puVar17 = puVar17 + 1;
        do {
          (*pauVar2)[0] = puVar17[-1];
          (*pauVar2)[1] = *puVar17;
          pauVar2 = (undefined1 (*) [16])(*pauVar2 + 2);
          puVar17 = puVar17 + lVar10;
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      uVar14 = uVar5 + 2;
      lVar24 = uVar5 + 3;
      lVar25 = lVar25 + 2;
      lVar12 = lVar12 + 2;
      lVar26 = lVar26 + 2;
      lVar8 = lVar8 + 2;
      local_50 = local_50 + 2;
      local_58 = local_58 + 2;
      uVar5 = uVar14;
    } while (lVar24 < lVar7);
  }
  if ((int)uVar14 < max_jj) {
    lVar12 = (long)(iVar19 * 4);
    lVar24 = (long)(int)uVar14;
    lVar25 = lVar24 + lVar22;
    lVar8 = iVar19 * 3 + lVar25;
    lVar13 = iVar19 * 2 + lVar25;
    lVar26 = lVar25 + lVar10;
    do {
      pvVar1 = B->data;
      lVar21 = B->w * lVar3 * B->elemsize;
      if (max_kk < 4) {
        lVar9 = (long)pvVar1 + lVar22 + lVar24;
        uVar20 = 0;
      }
      else {
        lVar9 = (long)pvVar1 + lVar25;
        lVar15 = (long)pvVar1 + lVar8;
        lVar6 = lVar13 + (long)pvVar1;
        lVar18 = (long)pvVar1 + lVar26;
        iVar19 = 3;
        do {
          (*pauVar2)[0] = *(undefined1 *)(lVar9 + lVar21);
          (*pauVar2)[1] = *(undefined1 *)(lVar18 + lVar21);
          (*pauVar2)[2] = *(undefined1 *)(lVar6 + lVar21);
          (*pauVar2)[3] = *(undefined1 *)(lVar15 + lVar21);
          pauVar2 = (undefined1 (*) [16])(*pauVar2 + 4);
          iVar19 = iVar19 + 4;
          lVar9 = lVar9 + lVar12;
          lVar15 = lVar15 + lVar12;
          lVar6 = lVar6 + lVar12;
          lVar18 = lVar18 + lVar12;
          uVar20 = max_kk & 0xfffffffc;
        } while (iVar19 < max_kk);
      }
      puVar17 = (undefined1 *)(lVar9 + lVar21);
      iVar19 = max_kk - uVar20;
      if (iVar19 != 0 && (int)uVar20 <= max_kk) {
        do {
          (*pauVar2)[0] = *puVar17;
          pauVar2 = (undefined1 (*) [16])(*pauVar2 + 1);
          puVar17 = puVar17 + lVar10;
          iVar19 = iVar19 + -1;
        } while (iVar19 != 0);
      }
      lVar24 = lVar24 + 1;
      lVar25 = lVar25 + 1;
      lVar8 = lVar8 + 1;
      lVar13 = lVar13 + 1;
      lVar26 = lVar26 + 1;
    } while (lVar24 != lVar7);
  }
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avxvnniint8(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}